

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day14a.cpp
# Opt level: O3

void day14a::hash_and_stretch(char *key,int index,int stretch,MD5Cache *cache)

{
  char *__s;
  int length;
  int iVar1;
  MD5Value value;
  
  __s = cache->md5;
  length = snprintf(__s,0x24,"%s%d",key,index);
  if (-1 < stretch) {
    iVar1 = stretch + 1;
    do {
      value = md5(__s,length);
      md5_to_chars(__s,value);
      length = 0x20;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  cache->index = index;
  return;
}

Assistant:

void hash_and_stretch(const char *key, int index, int stretch, MD5Cache& cache) {
		int length = std::snprintf(cache.md5, 36, "%s%d", key, index);
		for(int i = 0; i <= stretch; ++i) {
			auto hash = md5(cache.md5, length);
			md5_to_chars(cache.md5, hash);
			length = 32;
		}
		cache.index = index;
	}